

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_update_format(bcf_hdr_t *hdr,bcf1_t *line,char *key,void *values,int n,int type)

{
  uint uVar1;
  uint uVar2;
  uint8_t *puVar3;
  undefined4 uVar4;
  int iVar5;
  bcf_fmt_t *pbVar6;
  bcf_fmt_t *pbVar7;
  bcf_fmt_t *local_88;
  int p_free;
  uint8_t *ptr;
  undefined1 auStack_68 [4];
  int t;
  kstring_t str;
  bcf_fmt_t *pbStack_48;
  int nps;
  bcf_fmt_t *fmt;
  int fmt_id;
  int i;
  int type_local;
  int n_local;
  void *values_local;
  char *key_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  iVar5 = bcf_hdr_id2int(hdr,0,key);
  if ((iVar5 < 0) || (((hdr->id[0][iVar5].val)->info[2] & 0xf) == 0xf)) {
    if (n == 0) {
      hdr_local._4_4_ = 0;
    }
    else {
      hdr_local._4_4_ = -1;
    }
  }
  else {
    if ((line->unpacked & 8U) == 0) {
      bcf_unpack(line,8);
    }
    fmt._4_4_ = 0;
    while (((int)fmt._4_4_ < (int)((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff)
           && ((line->d).fmt[(int)fmt._4_4_].id != iVar5))) {
      fmt._4_4_ = fmt._4_4_ + 1;
    }
    if (fmt._4_4_ == ((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff)) {
      local_88 = (bcf_fmt_t *)0x0;
    }
    else {
      local_88 = (line->d).fmt + (int)fmt._4_4_;
    }
    if (n == 0) {
      if (local_88 != (bcf_fmt_t *)0x0) {
        if (*(int *)&local_88->field_0x1c < 0) {
          free(local_88->p + -(long)(int)(*(uint *)&local_88->field_0x1c & 0x7fffffff));
          *(uint *)&local_88->field_0x1c = *(uint *)&local_88->field_0x1c & 0x7fffffff;
        }
        (line->d).indiv_dirty = 1;
        local_88->p = (uint8_t *)0x0;
      }
      hdr_local._4_4_ = 0;
    }
    else {
      *(ulong *)&line->field_0x10 =
           *(ulong *)&line->field_0x10 & 0xffffffffff | (ulong)(uint)hdr->n[2] << 0x28;
      str.s._4_4_ = n / (int)(uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28);
      if ((str.s._4_4_ == 0) ||
         (str.s._4_4_ * (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28) != n)) {
        __assert_fail("nps && nps*line->n_sample==n",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0xae5,
                      "int bcf_update_format(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                     );
      }
      memset(auStack_68,0,0x18);
      bcf_enc_int1((kstring_t *)auStack_68,iVar5);
      if (type == 1) {
        bcf_enc_vint((kstring_t *)auStack_68,n,(int32_t *)values,str.s._4_4_);
      }
      else if (type == 2) {
        bcf_enc_size((kstring_t *)auStack_68,str.s._4_4_,5);
        kputsn((char *)values,
               str.s._4_4_ * (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28) * 4,
               (kstring_t *)auStack_68);
      }
      else {
        if (type != 3) {
          fprintf(_stderr,"[E::%s] the type %d not implemented yet\n","bcf_update_format",
                  (ulong)(uint)type);
          abort();
        }
        bcf_enc_size((kstring_t *)auStack_68,str.s._4_4_,7);
        kputsn((char *)values,str.s._4_4_ * (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28),
               (kstring_t *)auStack_68);
      }
      if (local_88 == (bcf_fmt_t *)0x0) {
        *(ulong *)&line->field_0x10 =
             *(ulong *)&line->field_0x10 & 0xffffff00ffffffff |
             ((ulong)(((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff) + 1) & 0xff)
             << 0x20;
        if ((line->d).m_fmt < (int)((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff))
        {
          iVar5 = (line->d).m_fmt;
          (line->d).m_fmt = (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff;
          (line->d).m_fmt = (line->d).m_fmt + -1;
          (line->d).m_fmt = (line->d).m_fmt >> 1 | (line->d).m_fmt;
          (line->d).m_fmt = (line->d).m_fmt >> 2 | (line->d).m_fmt;
          (line->d).m_fmt = (line->d).m_fmt >> 4 | (line->d).m_fmt;
          (line->d).m_fmt = (line->d).m_fmt >> 8 | (line->d).m_fmt;
          (line->d).m_fmt = (line->d).m_fmt >> 0x10 | (line->d).m_fmt;
          (line->d).m_fmt = (line->d).m_fmt + 1;
          pbVar6 = (bcf_fmt_t *)realloc((line->d).fmt,(long)(line->d).m_fmt << 5);
          (line->d).fmt = pbVar6;
          memset((line->d).fmt + iVar5,0,(long)((line->d).m_fmt - iVar5) << 5);
        }
        if ((((((uint)(*(ulong *)&line->field_0x10 >> 0x20) & 0xff) == 1 ||
               (*(ulong *)&line->field_0x10 & 0xff00000000) == 0) || (*key != 'G')) ||
            (key[1] != 'T')) || (key[2] != '\0')) {
          pbStack_48 = (line->d).fmt +
                       (int)(((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff) - 1);
        }
        else {
          uVar1 = (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff;
          while (fmt._4_4_ = uVar1 - 1, 0 < (int)fmt._4_4_) {
            pbVar6 = (line->d).fmt + (int)fmt._4_4_;
            pbVar7 = (line->d).fmt + (int)(uVar1 - 2);
            iVar5 = pbVar7->n;
            pbVar6->id = pbVar7->id;
            pbVar6->n = iVar5;
            iVar5 = pbVar7->type;
            pbVar6->size = pbVar7->size;
            pbVar6->type = iVar5;
            pbVar6->p = pbVar7->p;
            uVar4 = *(undefined4 *)&pbVar7->field_0x1c;
            pbVar6->p_len = pbVar7->p_len;
            *(undefined4 *)&pbVar6->field_0x1c = uVar4;
            uVar1 = fmt._4_4_;
          }
          pbStack_48 = (line->d).fmt;
        }
        bcf_unpack_fmt_core1
                  ((uint8_t *)str.m,(uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28),
                   pbStack_48);
        (line->d).indiv_dirty = 1;
        *(uint *)&pbStack_48->field_0x1c =
             *(uint *)&pbStack_48->field_0x1c & 0x7fffffff | 0x80000000;
      }
      else if (local_88->p_len + (*(uint *)&local_88->field_0x1c & 0x7fffffff) < _auStack_68) {
        if (*(int *)&local_88->field_0x1c < 0) {
          __assert_fail("!fmt->p_free",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                        ,0xb1f,
                        "int bcf_update_format(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                       );
        }
        bcf_unpack_fmt_core1
                  ((uint8_t *)str.m,(uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28),local_88
                  );
        *(uint *)&local_88->field_0x1c = *(uint *)&local_88->field_0x1c & 0x7fffffff | 0x80000000;
        (line->d).indiv_dirty = 1;
      }
      else {
        if (_auStack_68 != local_88->p_len + (*(uint *)&local_88->field_0x1c & 0x7fffffff)) {
          (line->d).indiv_dirty = 1;
        }
        puVar3 = local_88->p;
        uVar1 = *(uint *)&local_88->field_0x1c;
        memcpy(puVar3 + -(long)(int)(uVar1 & 0x7fffffff),(void *)str.m,_auStack_68);
        free((void *)str.m);
        uVar2 = *(uint *)&local_88->field_0x1c;
        bcf_unpack_fmt_core1
                  (puVar3 + -(long)(int)(uVar1 & 0x7fffffff),
                   (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28),local_88);
        *(uint *)&local_88->field_0x1c =
             *(uint *)&local_88->field_0x1c & 0x7fffffff | uVar2 & 0x80000000;
      }
      line->unpacked = line->unpacked | 8;
      hdr_local._4_4_ = 0;
    }
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_update_format(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const void *values, int n, int type)
{
    // Is the field already present?
    int i, fmt_id = bcf_hdr_id2int(hdr,BCF_DT_ID,key);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,fmt_id) )
    {
        if ( !n ) return 0;
        return -1;  // the key not present in the header
    }

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==fmt_id ) break;
    bcf_fmt_t *fmt = i==line->n_fmt ? NULL : &line->d.fmt[i];

    if ( !n )
    {
        if ( fmt )
        {
            // Mark the tag for removal, free existing memory if necessary
            if ( fmt->p_free )
            {
                free(fmt->p - fmt->p_off);
                fmt->p_free = 0;
            }
            line->d.indiv_dirty = 1;
            fmt->p = NULL;
        }
        return 0;
    }

    line->n_sample = bcf_hdr_nsamples(hdr);
    int nps = n / line->n_sample;  // number of values per sample
    assert( nps && nps*line->n_sample==n );     // must be divisible by n_sample

    // Encode the values and determine the size required to accommodate the values
    kstring_t str = {0,0,0};
    bcf_enc_int1(&str, fmt_id);
    if ( type==BCF_HT_INT )
        bcf_enc_vint(&str, n, (int32_t*)values, nps);
    else if ( type==BCF_HT_REAL )
    {
        bcf_enc_size(&str, nps, BCF_BT_FLOAT);
        kputsn((char*)values, nps*line->n_sample*sizeof(float), &str);
    }
    else if ( type==BCF_HT_STR )
    {
        bcf_enc_size(&str, nps, BCF_BT_CHAR);
        kputsn((char*)values, nps*line->n_sample, &str);
    }
    else
    {
        fprintf(stderr, "[E::%s] the type %d not implemented yet\n", __func__, type);
        abort();
    }

    if ( !fmt )
    {
        // Not present, new format field
        line->n_fmt++;
        hts_expand0(bcf_fmt_t, line->n_fmt, line->d.m_fmt, line->d.fmt);

        // Special case: VCF specification requires that GT is always first
        if ( line->n_fmt > 1 && key[0]=='G' && key[1]=='T' && !key[2] )
        {
            for (i=line->n_fmt-1; i>0; i--)
                line->d.fmt[i] = line->d.fmt[i-1];
            fmt = &line->d.fmt[0];
        }
        else
            fmt = &line->d.fmt[line->n_fmt-1];
        bcf_unpack_fmt_core1((uint8_t*)str.s, line->n_sample, fmt);
        line->d.indiv_dirty = 1;
        fmt->p_free = 1;
    }
    else
    {
        // The tag is already present, check if it is big enough to accomodate the new block
        if ( str.l <= fmt->p_len + fmt->p_off )
        {
            // good, the block is big enough
            if ( str.l != fmt->p_len + fmt->p_off ) line->d.indiv_dirty = 1;
            uint8_t *ptr = fmt->p - fmt->p_off;
            memcpy(ptr, str.s, str.l);
            free(str.s);
            int p_free = fmt->p_free;
            bcf_unpack_fmt_core1(ptr, line->n_sample, fmt);
            fmt->p_free = p_free;
        }
        else
        {
            assert( !fmt->p_free );  // fix the caller or improve here: this has been modified before
            bcf_unpack_fmt_core1((uint8_t*)str.s, line->n_sample, fmt);
            fmt->p_free = 1;
            line->d.indiv_dirty = 1;
        }
    }
    line->unpacked |= BCF_UN_FMT;
    return 0;
}